

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::init(SRGBTestCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  deUint32 dVar2;
  int iVar3;
  int extraout_EAX;
  ObjectWrapper *this_00;
  undefined4 extraout_var;
  ObjectTraits *traits;
  NotSupportedError *pNVar4;
  string local_40;
  
  dVar2 = glu::getInternalFormat(this->m_internalFormat);
  if (dVar2 == 0x8c43) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_texture_sRGB_decode");
    if (!bVar1) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Test requires GL_EXT_texture_sRGB_decode extension","");
      tcu::NotSupportedError::NotSupportedError(pNVar4,&local_40);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  dVar2 = glu::getInternalFormat(this->m_internalFormat);
  if (dVar2 == 0x8fbd) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_texture_sRGB_R8");
    if (!bVar1) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Test requires GL_EXT_texture_sRGB_R8 extension","");
      tcu::NotSupportedError::NotSupportedError(pNVar4,&local_40);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  this_00 = (ObjectWrapper *)operator_new(0x18);
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(this_00,(Functions *)CONCAT44(extraout_var,iVar3),traits);
  local_40._M_dataplus._M_p = (pointer)0x0;
  if (&((this->m_framebuffer).
        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
        .m_data.ptr)->super_ObjectWrapper != this_00) {
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::reset(&(this->m_framebuffer).
             super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
           );
    (this->m_framebuffer).
    super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)this_00;
  }
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
           *)&local_40);
  return extraout_EAX;
}

Assistant:

void SRGBTestCase::init (void)
{
	// extension requirements for test
	if ( (glu::getInternalFormat(m_internalFormat) == GL_SRGB8_ALPHA8) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_sRGB_decode") )
	{
		throw tcu::NotSupportedError("Test requires GL_EXT_texture_sRGB_decode extension");
	}

	if ( (glu::getInternalFormat(m_internalFormat) == GL_SR8_EXT) && !(m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_sRGB_R8")) )
	{
		throw tcu::NotSupportedError("Test requires GL_EXT_texture_sRGB_R8 extension");
	}

	m_framebuffer = de::MovePtr<glu::Framebuffer>(new glu::Framebuffer(m_context.getRenderContext()));
}